

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

size_t __thiscall TimeStampResp::SetDataSize(TimeStampResp *this)

{
  size_t sVar1;
  size_t sVar2;
  TimeStampResp *this_local;
  
  sVar1 = DerBase::EncodedSize(&(this->status).super_DerBase);
  sVar2 = DerBase::EncodedSize(&(this->timeStampToken).super_DerBase);
  (this->super_DerBase).cbData = sVar1 + sVar2;
  return (this->super_DerBase).cbData;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData = status.EncodedSize() + timeStampToken.EncodedSize();
		return cbData;
	}